

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O1

Belief * __thiscall despot::Pocman::InitialBelief(Pocman *this,State *start,string type)

{
  int iVar1;
  State *pSVar2;
  PocmanBelief *this_00;
  char *__end;
  size_type __n;
  size_type sVar3;
  allocator_type local_89;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_88;
  double local_70;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_68;
  long *local_50 [2];
  long local_40 [2];
  
  iVar1 = PocmanBelief::num_particles;
  __n = (size_type)PocmanBelief::num_particles;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_88,__n,&local_89);
  if (0 < (long)__n) {
    local_70 = 1.0 / (double)iVar1;
    sVar3 = 0;
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"DEFAULT","");
      pSVar2 = (State *)(**(code **)(*(long *)this + 0x40))(this,(string *)local_50);
      local_88.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start[sVar3] = pSVar2;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      *(double *)
       (local_88.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_start[sVar3] + 0x18) = local_70;
      sVar3 = sVar3 + 1;
    } while (__n != sVar3);
  }
  this_00 = (PocmanBelief *)operator_new(0x98);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_68,&local_88);
  PocmanBelief::PocmanBelief(this_00,&local_68,&this->super_DSPOMDP,(Belief *)0x0);
  if (local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Belief *)this_00;
}

Assistant:

Belief* Pocman::InitialBelief(const State* start, string type) const {
	int N = PocmanBelief::num_particles;
	vector<State*> particles(N);
	for (int i = 0; i < N; i++) {
		particles[i] = CreateStartState();
		particles[i]->weight = 1.0 / N;
	}

	return new PocmanBelief(particles, this);
}